

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe46At5(uint8_t *buf)

{
  return ((ulong)((uint)buf[4] | (uint)buf[5] << 8 | (buf[6] & 7) << 0x10) << 0x1b |
         (ulong)((uint)buf[2] << 0xb | (uint)buf[3] << 0x13)) + (ulong)buf[1] * 8 |
         (ulong)(*buf >> 5);
}

Assistant:

std::uint64_t readFlUIntLe46At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 3;
    res |= (buf[0] >> 5);
    res &= UINT64_C(0x3fffffffffff);
    return res;
}